

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Validators_inl.hpp
# Opt level: O1

Validator * __thiscall
CLI::Validator::description
          (Validator *__return_storage_ptr__,Validator *this,string *validator_desc)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  bool bVar3;
  anon_class_32_1_5ff8519c local_40;
  
  std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  ::function(&__return_storage_ptr__->desc_function_,&this->desc_function_);
  std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::function(&__return_storage_ptr__->func_,&this->func_);
  (__return_storage_ptr__->name_)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->name_).field_2;
  pcVar2 = (this->name_)._M_dataplus._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->name_,pcVar2,pcVar2 + (this->name_)._M_string_length
            );
  bVar3 = this->non_modifying_;
  __return_storage_ptr__->active_ = this->active_;
  __return_storage_ptr__->non_modifying_ = bVar3;
  __return_storage_ptr__->application_index_ = this->application_index_;
  paVar1 = &local_40.validator_desc.field_2;
  pcVar2 = (validator_desc->_M_dataplus)._M_p;
  local_40.validator_desc._M_dataplus._M_p = (pointer)paVar1;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_40,pcVar2,pcVar2 + validator_desc->_M_string_length);
  ::std::function<std::__cxx11::string()>::operator=
            ((function<std::__cxx11::string()> *)__return_storage_ptr__,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.validator_desc._M_dataplus._M_p != paVar1) {
    operator_delete(local_40.validator_desc._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

CLI11_NODISCARD CLI11_INLINE Validator Validator::description(std::string validator_desc) const {
    Validator newval(*this);
    newval.desc_function_ = [validator_desc]() { return validator_desc; };
    return newval;
}